

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterClass.h
# Opt level: O2

void __thiscall CharacterClass::CharacterClass(CharacterClass *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_11;
  
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_skill_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_skill_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->m_name,"",&local_11);
  return;
}

Assistant:

CharacterClass() : m_name("") { }